

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::LogUnused(cmMakefile *this,char *reason,string *name)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  byte local_2ea;
  byte local_2b9;
  string local_2a8;
  undefined1 local_288 [8];
  ostringstream msg;
  bool local_10a;
  allocator local_109;
  string local_108;
  byte local_e3;
  byte local_e2;
  allocator local_e1;
  string local_e0;
  byte local_bb;
  byte local_ba;
  allocator local_b9;
  string local_b8;
  cmListFileContext local_88;
  undefined1 local_40 [8];
  string path;
  string *name_local;
  char *reason_local;
  cmMakefile *this_local;
  
  if ((this->WarnUnused & 1U) != 0) {
    path.field_2._8_8_ = name;
    std::__cxx11::string::string((string *)local_40);
    bVar1 = std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::empty
                      (&this->ExecutionStatusStack);
    if (bVar1) {
      pcVar2 = GetCurrentSourceDirectory(this);
      std::__cxx11::string::operator=((string *)local_40,pcVar2);
      std::__cxx11::string::operator+=((string *)local_40,"/CMakeLists.txt");
    }
    else {
      GetExecutionContext(&local_88,this);
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_88.FilePath);
      cmListFileContext::~cmListFileContext(&local_88);
    }
    local_ba = 0;
    local_bb = 0;
    local_e2 = 0;
    local_e3 = 0;
    local_10a = false;
    local_2b9 = 1;
    if ((this->CheckSystemVars & 1U) == 0) {
      pcVar2 = GetHomeDirectory(this);
      std::allocator<char>::allocator();
      local_ba = 1;
      std::__cxx11::string::string((string *)&local_b8,pcVar2,&local_b9);
      local_bb = 1;
      bVar1 = cmsys::SystemTools::IsSubDirectory((string *)local_40,&local_b8);
      local_2b9 = 1;
      if (!bVar1) {
        pcVar2 = GetHomeOutputDirectory(this);
        std::allocator<char>::allocator();
        local_e2 = 1;
        std::__cxx11::string::string((string *)&local_e0,pcVar2,&local_e1);
        local_e3 = 1;
        local_10a = cmsys::SystemTools::IsSubDirectory((string *)local_40,&local_e0);
        local_2ea = 0;
        if (local_10a) {
          pcVar2 = cmake::GetCMakeFilesDirectory();
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_108,pcVar2,&local_109);
          bVar1 = cmsys::SystemTools::IsSubDirectory((string *)local_40,&local_108);
          local_2ea = bVar1 ^ 0xff;
        }
        local_2b9 = local_2ea;
      }
    }
    if (local_10a != false) {
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
    if ((local_e3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_e0);
    }
    if ((local_e2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    }
    if ((local_bb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b8);
    }
    if ((local_ba & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    if ((local_2b9 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
      poVar3 = std::operator<<((ostream *)local_288,"unused variable (");
      poVar3 = std::operator<<(poVar3,reason);
      poVar3 = std::operator<<(poVar3,") \'");
      poVar3 = std::operator<<(poVar3,(string *)path.field_2._8_8_);
      std::operator<<(poVar3,"\'");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,AUTHOR_WARNING,&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmMakefile::LogUnused(const char* reason, const std::string& name) const
{
  if (this->WarnUnused) {
    std::string path;
    if (!this->ExecutionStatusStack.empty()) {
      path = this->GetExecutionContext().FilePath;
    } else {
      path = this->GetCurrentSourceDirectory();
      path += "/CMakeLists.txt";
    }

    if (this->CheckSystemVars ||
        cmSystemTools::IsSubDirectory(path, this->GetHomeDirectory()) ||
        (cmSystemTools::IsSubDirectory(path, this->GetHomeOutputDirectory()) &&
         !cmSystemTools::IsSubDirectory(path,
                                        cmake::GetCMakeFilesDirectory()))) {
      std::ostringstream msg;
      msg << "unused variable (" << reason << ") \'" << name << "\'";
      this->IssueMessage(cmake::AUTHOR_WARNING, msg.str());
    }
  }
}